

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argh.h
# Opt level: O0

void __thiscall argh::parser::parse(parser *this,int argc,char **argv,int mode)

{
  char cVar1;
  bool bVar2;
  uint uVar3;
  iterator iVar4;
  size_type sVar5;
  reference pvVar6;
  long lVar7;
  long lVar8;
  char *pcVar9;
  ulong uVar10;
  bool local_25a;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_208;
  byte local_1c1;
  iterator iStack_1c0;
  bool preferParam;
  _Base_ptr local_1b8;
  allocator<char> local_1aa;
  char local_1a9;
  char *local_1a8;
  undefined8 local_1a0;
  string local_198 [32];
  reference local_178;
  char *c;
  iterator __end3;
  iterator __begin3;
  string *__range3;
  string local_150 [32];
  string local_130 [8];
  string keep_param;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100 [48];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0 [32];
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_b0;
  long local_70;
  size_type equalPos;
  string name;
  uint local_44;
  uint i;
  int mode_local;
  char **argv_local;
  int argc_local;
  parser *this_local;
  
  std::
  multiset<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(&this->flags_);
  std::
  multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::clear(&this->params_);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(&this->pos_args_);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::resize(&this->args_,(long)argc);
  iVar4 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::begin(&this->args_);
  std::
  transform<char_const*const*,__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,argh::parser::parse(int,char_const*const*,int)::_lambda(char_const*)_1_>
            (argv,argv + argc,iVar4._M_current);
  local_44 = 0;
  do {
    sVar5 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size(&this->args_);
    if (sVar5 <= local_44) {
      return;
    }
    pvVar6 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](&this->args_,(ulong)local_44);
    bVar2 = is_option(this,pvVar6);
    if (bVar2) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator[](&this->args_,(ulong)local_44);
      trim_leading_dashes((parser *)&equalPos,(string *)this);
      if (((mode & 4U) == 0) &&
         (local_70 = std::__cxx11::string::find((char)&equalPos,0x3d), local_70 != -1)) {
        std::__cxx11::string::substr((ulong)local_d0,(ulong)&equalPos);
        std::__cxx11::string::substr((ulong)local_100,(ulong)&equalPos);
        std::
        pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::
        pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                  (&local_b0,local_d0,local_100);
        std::
        multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::insert(&this->params_,&local_b0);
        std::
        pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~pair(&local_b0);
        std::__cxx11::string::~string((string *)local_100);
        std::__cxx11::string::~string((string *)local_d0);
      }
      else {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator[](&this->args_,(ulong)local_44);
        lVar7 = std::__cxx11::string::size();
        lVar8 = std::__cxx11::string::size();
        if ((lVar7 - lVar8 == 1) &&
           (((mode & 8U) != 0 && (bVar2 = is_param(this,(string *)&equalPos), !bVar2)))) {
          std::__cxx11::string::string(local_130);
          uVar3 = std::__cxx11::string::empty();
          __range3._6_1_ = 0;
          __range3._5_1_ = 0;
          local_25a = false;
          if ((uVar3 & 1) == 0) {
            pcVar9 = (char *)std::__cxx11::string::back();
            cVar1 = *pcVar9;
            std::allocator<char>::allocator();
            __range3._6_1_ = 1;
            std::__cxx11::string::string(local_150,1,cVar1,(allocator *)((long)&__range3 + 7));
            __range3._5_1_ = 1;
            local_25a = is_param(this,(string *)local_150);
          }
          if ((__range3._5_1_ & 1) != 0) {
            std::__cxx11::string::~string(local_150);
          }
          if ((__range3._6_1_ & 1) != 0) {
            std::allocator<char>::~allocator((allocator<char> *)((long)&__range3 + 7));
          }
          if (local_25a != false) {
            pcVar9 = (char *)std::__cxx11::string::back();
            std::__cxx11::string::operator+=(local_130,*pcVar9);
            std::__cxx11::string::size();
            std::__cxx11::string::resize((ulong)&equalPos);
          }
          __end3._M_current = (char *)std::__cxx11::string::begin();
          c = (char *)std::__cxx11::string::end();
          while (bVar2 = __gnu_cxx::operator!=
                                   (&__end3,(__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                             *)&c), bVar2) {
            local_178 = __gnu_cxx::
                        __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        ::operator*(&__end3);
            local_1a9 = *local_178;
            local_1a8 = &local_1a9;
            local_1a0 = 1;
            std::allocator<char>::allocator();
            std::__cxx11::string::string(local_198,local_1a8,local_1a0,&local_1aa);
            local_1b8 = (_Base_ptr)
                        std::
                        multiset<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                        ::emplace<std::__cxx11::string>
                                  ((multiset<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                                    *)&this->flags_,
                                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)local_198);
            std::__cxx11::string::~string(local_198);
            std::allocator<char>::~allocator(&local_1aa);
            __gnu_cxx::
            __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator++(&__end3);
          }
          uVar10 = std::__cxx11::string::empty();
          bVar2 = (uVar10 & 1) != 0;
          if (!bVar2) {
            std::__cxx11::string::operator=((string *)&equalPos,local_130);
          }
          std::__cxx11::string::~string(local_130);
          if (bVar2) goto LAB_001032f7;
        }
        sVar5 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::size(&this->args_);
        if ((ulong)local_44 != sVar5 - 1) {
          pvVar6 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::operator[](&this->args_,(ulong)(local_44 + 1));
          bVar2 = is_option(this,pvVar6);
          if (!bVar2) {
            if ((mode & 1U) != 0 && (mode & 2U) != 0) {
              __assert_fail("!(mode & argh::parser::PREFER_FLAG_FOR_UNREG_OPTION) || !(mode & argh::parser::PREFER_PARAM_FOR_UNREG_OPTION)"
                            ,
                            "/workspace/llm4binary/github/license_c_cmakelists/adishavit[P]argh/argh.h"
                            ,0x113,"void argh::parser::parse(int, const char *const *, int)");
            }
            local_1c1 = (byte)((mode & 2U) >> 1);
            bVar2 = is_param(this,(string *)&equalPos);
            if ((bVar2) || ((local_1c1 & 1) != 0)) {
              pvVar6 = std::
                       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ::operator[](&this->args_,(ulong)(local_44 + 1));
              std::
              pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::
              pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_true>
                        (&local_208,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &equalPos,pvVar6);
              std::
              multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::insert(&this->params_,&local_208);
              std::
              pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::~pair(&local_208);
              local_44 = local_44 + 1;
            }
            else {
              std::
              multiset<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              ::emplace<std::__cxx11::string&>
                        ((multiset<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                          *)&this->flags_,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &equalPos);
            }
            goto LAB_001032f7;
          }
        }
        iStack_1c0 = std::
                     multiset<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                     ::emplace<std::__cxx11::string&>
                               ((multiset<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                                 *)&this->flags_,
                                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )&equalPos);
      }
LAB_001032f7:
      std::__cxx11::string::~string((string *)&equalPos);
    }
    else {
      pvVar6 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[](&this->args_,(ulong)local_44);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string&>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 &this->pos_args_,pvVar6);
    }
    local_44 = local_44 + 1;
  } while( true );
}

Assistant:

inline void parser::parse(int argc, const char* const argv[], int mode /*= PREFER_FLAG_FOR_UNREG_OPTION*/)
   {
      // clear out possible previous parsing remnants
      flags_.clear();
      params_.clear();
      pos_args_.clear();

      // convert to strings
      args_.resize(static_cast<decltype(args_)::size_type>(argc));
      std::transform(argv, argv + argc, args_.begin(), [](const char* const arg) { return arg;  });

      // parse line
      for (auto i = 0u; i < args_.size(); ++i)
      {
         if (!is_option(args_[i]))
         {
            pos_args_.emplace_back(args_[i]);
            continue;
         }

         auto name = trim_leading_dashes(args_[i]);

         if (!(mode & NO_SPLIT_ON_EQUALSIGN))
         {
            auto equalPos = name.find('=');
            if (equalPos != std::string::npos)
            {
               params_.insert({ name.substr(0, equalPos), name.substr(equalPos + 1) });
               continue;
            }
         }

         // if the option is unregistered and should be a multi-flag
         if (1 == (args_[i].size() - name.size()) &&         // single dash
            argh::parser::SINGLE_DASH_IS_MULTIFLAG & mode && // multi-flag mode
            !is_param(name))                                  // unregistered
         {
            std::string keep_param;

            if (!name.empty() && is_param(std::string(1ul, name.back()))) // last char is param
            {
               keep_param += name.back();
               name.resize(name.size() - 1);
            }

            for (auto const& c : name)
            {
               flags_.emplace(std::string{ c });
            }

            if (!keep_param.empty())
            {
               name = keep_param;
            }
            else
            {
               continue; // do not consider other options for this arg
            }
         }

         // any potential option will get as its value the next arg, unless that arg is an option too
         // in that case it will be determined a flag.
         if (i == args_.size() - 1 || is_option(args_[i + 1]))
         {
            flags_.emplace(name);
            continue;
         }

         // if 'name' is a pre-registered option, then the next arg cannot be a free parameter to it is skipped
         // otherwise we have 2 modes:
         // PREFER_FLAG_FOR_UNREG_OPTION: a non-registered 'name' is determined a flag.
         //                               The following value (the next arg) will be a free parameter.
         //
         // PREFER_PARAM_FOR_UNREG_OPTION: a non-registered 'name' is determined a parameter, the next arg
         //                                will be the value of that option.

         assert(!(mode & argh::parser::PREFER_FLAG_FOR_UNREG_OPTION)
             || !(mode & argh::parser::PREFER_PARAM_FOR_UNREG_OPTION));

         bool preferParam = mode & argh::parser::PREFER_PARAM_FOR_UNREG_OPTION;

         if (is_param(name) || preferParam)
         {
            params_.insert({ name, args_[i + 1] });
            ++i; // skip next value, it is not a free parameter
            continue;
         }
         else
         {
            flags_.emplace(name);
         }
      }
   }